

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void replace_default_logger_example(void)

{
  allocator local_10a;
  allocator local_109;
  shared_ptr<spdlog::logger> new_logger;
  shared_ptr<spdlog::logger> old_logger;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> local_d8;
  string local_c8 [32];
  filename_t local_a8;
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  spdlog::default_logger();
  std::__cxx11::string::string((string *)&local_a8,"new_default_logger",&local_109);
  std::__cxx11::string::string(local_c8,"logs/new-default-log.txt",&local_10a);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  spdlog::basic_logger_mt<spdlog::synchronous_factory>
            ((string *)&new_logger,&local_a8,SUB81(local_c8,0),(file_event_handlers *)0x1);
  spdlog::file_event_handlers::~file_event_handlers((file_event_handlers *)&local_88);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d8,&new_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>);
  spdlog::set_default_logger((shared_ptr<spdlog::logger> *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  spdlog::set_level(info);
  spdlog::debug<char[38]>((char (*) [38])"This message should not be displayed!");
  spdlog::set_level(trace);
  spdlog::debug<char[35]>((char (*) [35])"This message should be displayed..");
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e8,&old_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>);
  spdlog::set_default_logger((shared_ptr<spdlog::logger> *)&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&old_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void replace_default_logger_example() {
    // store the old logger so we don't break other examples.
    auto old_logger = spdlog::default_logger();

    auto new_logger =
        spdlog::basic_logger_mt("new_default_logger", "logs/new-default-log.txt", true);
    spdlog::set_default_logger(new_logger);
    spdlog::set_level(spdlog::level::info);
    spdlog::debug("This message should not be displayed!");
    spdlog::set_level(spdlog::level::trace);
    spdlog::debug("This message should be displayed..");

    spdlog::set_default_logger(old_logger);
}